

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModelHelpers.c
# Opt level: O3

JL_STATUS JlAddBoolToListObject(JlDataObject *ListObject,_Bool BoolValue)

{
  JL_STATUS JVar1;
  JlDataObject *boolObject;
  JlDataObject *local_18;
  
  local_18 = (JlDataObject *)0x0;
  if (ListObject == (JlDataObject *)0x0) {
    JVar1 = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    JVar1 = JlCreateBoolObject(BoolValue,&local_18);
    if (JVar1 == JL_STATUS_SUCCESS) {
      JVar1 = JlAttachObjectToListObject(ListObject,local_18);
      if (JVar1 == JL_STATUS_SUCCESS) {
        JVar1 = JL_STATUS_SUCCESS;
      }
      else {
        JlFreeObjectTree(&local_18);
      }
    }
  }
  return JVar1;
}

Assistant:

JL_STATUS
    JlAddBoolToListObject
    (
        JlDataObject*       ListObject,         // [in,out]
        bool                BoolValue           // [in]
    )
{
    JL_STATUS jlStatus;
    JlDataObject* boolObject = NULL;

    if( NULL != ListObject )
    {
        jlStatus = JlCreateBoolObject( BoolValue, &boolObject );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            jlStatus = JlAttachObjectToListObject( ListObject, boolObject );
            if( JL_STATUS_SUCCESS != jlStatus )
            {
                (void) JlFreeObjectTree( &boolObject );
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}